

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.h
# Opt level: O0

cmList * __thiscall
cmList::get_items<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (cmList *__return_storage_ptr__,cmList *this,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last)

{
  allocator<long> local_51;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_50;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  vector<long,_std::allocator<long>_> local_40;
  cmList *local_28;
  cmList *this_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first_local;
  
  local_50._M_current = last._M_current;
  local_48._M_current = first._M_current;
  local_28 = this;
  this_local = (cmList *)last._M_current;
  last_local = first;
  std::allocator<long>::allocator(&local_51);
  std::vector<long,std::allocator<long>>::
  vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
            ((vector<long,std::allocator<long>> *)&local_40,local_48,local_50,&local_51);
  GetItems(__return_storage_ptr__,this,&local_40);
  std::vector<long,_std::allocator<long>_>::~vector(&local_40);
  std::allocator<long>::~allocator(&local_51);
  return __return_storage_ptr__;
}

Assistant:

cmList get_items(InputIterator first, InputIterator last) const
  {
    return this->GetItems(std::vector<index_type>{ first, last });
  }